

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int __thiscall Catch::Session::runInternal(Session *this)

{
  shared_ptr<Catch::Config> *__r;
  RunContext *this_00;
  _Rb_tree_header *p_Var1;
  pointer pTVar2;
  undefined8 *puVar3;
  element_type *peVar4;
  long lVar5;
  size_t sVar6;
  pointer pFVar7;
  int iVar8;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *pvVar9;
  long lVar10;
  ulong uVar11;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar12;
  undefined4 extraout_var;
  long *plVar13;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> _Var14;
  undefined4 extraout_var_00;
  undefined8 *puVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _Base_ptr p_Var16;
  FilterMatch *match_1;
  pointer pFVar17;
  pointer pTVar18;
  TestCase *test;
  __uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  local_318;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_310;
  vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
  *local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  Totals totals;
  IConfigPtr local_290;
  _Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
  local_280;
  TestGroup tests;
  
  if (this->m_startupExceptions == false) {
    iVar8 = 0;
    if (((this->m_configData).showHelp == false) &&
       (iVar8 = 0, (this->m_configData).libIdentify == false)) {
      config(this);
      seedRng(&((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_IConfig);
      __r = &this->m_config;
      if ((this->m_configData).filenamesAsTags == true) {
        pvVar9 = getAllTestCasesSorted
                           (&((__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->super_IConfig);
        pTVar2 = (pvVar9->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pTVar18 = (pvVar9->
                       super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                       _M_impl.super__Vector_impl_data._M_start; pTVar18 != pTVar2;
            pTVar18 = pTVar18 + 1) {
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&tags,&(pTVar18->super_TestCaseInfo).tags);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&tests,(pTVar18->super_TestCaseInfo).lineInfo.file,
                     (allocator<char> *)&local_290);
          lVar10 = std::__cxx11::string::find_last_of((char *)&tests,0x20c04f);
          if (lVar10 != -1) {
            std::__cxx11::string::erase((ulong)&tests,0);
            *(undefined1 *)
             &((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_IConfig).super_NonCopyable._vptr_NonCopyable = 0x23;
          }
          uVar11 = std::__cxx11::string::rfind((char)&tests,0x2e);
          if (uVar11 != 0xffffffffffffffff) {
            std::__cxx11::string::erase((ulong)&tests,uVar11);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&tags,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tests);
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&totals,&tags);
          setTags(&pTVar18->super_TestCaseInfo,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&totals);
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&totals);
          std::__cxx11::string::~string((string *)&tests);
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&tags);
        }
      }
      list((Catch *)&tests,__r);
      if (tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        clara::std::__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *)&tests,
                   &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<Catch::Config,void>
                  ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&local_290,
                   &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
        pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                  ::getInternal();
        iVar8 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
        plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x20))
                                    ((long *)CONCAT44(extraout_var,iVar8));
        if (*plVar13 == plVar13[1]) {
          peVar4 = (__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<Catch::Config,void>
                    ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&tags,
                     &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
          anon_unknown_1::createReporter
                    ((anon_unknown_1 *)&local_318,&(peVar4->m_data).reporterName,(IConfigPtr *)&tags
                    );
        }
        else {
          _Var14._M_head_impl = (IStreamingReporter *)operator_new(0x30);
          ((IStreamingReporter *)&(_Var14._M_head_impl)->_vptr_IStreamingReporter)->
          _vptr_IStreamingReporter = (_func_int **)&PTR__ListeningReporter_0024b940;
          (((Reporters *)(_Var14._M_head_impl + 1))->
          super__Vector_base<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          _Var14._M_head_impl[2] = (_func_int **)0x0;
          _Var14._M_head_impl[3] = (_func_int **)0x0;
          (((IStreamingReporterPtr *)(_Var14._M_head_impl + 4))->_M_t).
          super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
          .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               (IStreamingReporter *)0x0;
          *(bool *)&_Var14._M_head_impl[5]._vptr_IStreamingReporter = false;
          *(bool *)((long)&_Var14._M_head_impl[5]._vptr_IStreamingReporter + 1) = true;
          local_318._M_t.
          super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
          .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               (tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>)
               (tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>)
               _Var14._M_head_impl;
          pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                    ::getInternal();
          iVar8 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
          puVar15 = (undefined8 *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar8) + 0x20))
                              ((long *)CONCAT44(extraout_var_00,iVar8));
          local_308 = (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                       *)(_Var14._M_head_impl + 1);
          puVar3 = (undefined8 *)puVar15[1];
          local_280.super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               (_Head_base<0UL,_Catch::IStreamingReporter_*,_false>)
               (_Head_base<0UL,_Catch::IStreamingReporter_*,_false>)_Var14._M_head_impl;
          for (puVar15 = (undefined8 *)*puVar15; puVar15 != puVar3; puVar15 = puVar15 + 2) {
            plVar13 = (long *)*puVar15;
            std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<Catch::Config,void>
                      ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&totals,
                       &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
            ReporterConfig::ReporterConfig((ReporterConfig *)&tags,(IConfigPtr *)&totals);
            (**(code **)(*plVar13 + 0x10))(&local_310,plVar13,(ReporterConfig *)&tags);
            std::
            vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
            ::
            emplace_back<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>
                      (local_308,
                       (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                        *)&local_310);
            if (local_310._M_head_impl != (IStreamingReporter *)0x0) {
              (*(local_310._M_head_impl)->_vptr_IStreamingReporter[1])();
            }
            local_310._M_head_impl = (IStreamingReporter *)0x0;
            clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &tags.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&totals.assertions);
          }
          peVar4 = (__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<Catch::Config,void>
                    ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&tags,
                     &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
          anon_unknown_1::createReporter
                    ((anon_unknown_1 *)&totals,&(peVar4->m_data).reporterName,(IConfigPtr *)&tags);
          ListeningReporter::addReporter
                    ((ListeningReporter *)
                     local_280.super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                     _M_head_impl,(IStreamingReporterPtr *)&totals);
          if (totals._0_8_ != 0) {
            (**(code **)(*(long *)totals._0_8_ + 8))();
          }
          totals.error = 0;
          totals._4_4_ = 0;
        }
        clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &tags.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        this_00 = &tests.m_context;
        RunContext::RunContext(this_00,&local_290,(IStreamingReporterPtr *)&local_318);
        if (local_318._M_t.
            super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
            .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl !=
            (_Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             )0x0) {
          (**(code **)(*(long *)local_318._M_t.
                                super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                _M_head_impl + 8))();
        }
        clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_290.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        p_Var1 = &tests.m_tests._M_t._M_impl.super__Rb_tree_header;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tests.m_matches.
        super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        tests.m_matches.
        super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        tests.m_matches.
        super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        pvVar9 = getAllTestCasesSorted
                           (&(tests.m_config.
                              super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                             ->super_IConfig);
        iVar8 = (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
        TestSpec::matchesByFilter
                  ((Matches *)&tags,(TestSpec *)CONCAT44(extraout_var_01,iVar8),pvVar9,
                   &(tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_IConfig);
        clara::std::
        vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
        _M_move_assign(&tests.m_matches,
                       (vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                        *)&tags);
        clara::std::
        vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::~vector
                  ((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                    *)&tags);
        iVar8 = (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
        pFVar7 = tests.m_matches.
                 super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pFVar17 = tests.m_matches.
                  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((tests.m_matches.
             super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             tests.m_matches.
             super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (*(long *)(CONCAT44(extraout_var_02,iVar8) + 0x18) ==
            *(long *)(CONCAT44(extraout_var_02,iVar8) + 0x20))) {
          pTVar2 = (pvVar9->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pTVar18 = (pvVar9->
                         super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                         _M_impl.super__Vector_impl_data._M_start; pTVar18 != pTVar2;
              pTVar18 = pTVar18 + 1) {
            if (((pTVar18->super_TestCaseInfo).properties & IsHidden) == None) {
              tags.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar18;
              std::
              _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
              ::_M_emplace_unique<Catch::TestCase_const*>
                        ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                          *)&tests.m_tests,(TestCase **)&tags);
            }
          }
        }
        else {
          for (; pFVar17 != pFVar7; pFVar17 = pFVar17 + 1) {
            std::
            _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
            ::
            _M_insert_range_unique<__gnu_cxx::__normal_iterator<Catch::TestCase_const*const*,std::vector<Catch::TestCase_const*,std::allocator<Catch::TestCase_const*>>>>
                      ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                        *)&tests.m_tests,
                       (__normal_iterator<const_Catch::TestCase_*const_*,_std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>_>
                        )(pFVar17->tests).
                         super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<const_Catch::TestCase_*const_*,_std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>_>
                        )(pFVar17->tests).
                         super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
        iVar8 = (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
        totals._0_8_ = totals._0_8_ & 0xffffffff00000000;
        totals.assertions.passed = 0;
        totals.assertions.failed = 0;
        totals.assertions.failedButOk = 0;
        totals.testCases.passed = 0;
        totals.testCases.failed = 0;
        totals.testCases.failedButOk = 0;
        (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_IConfig).super_NonCopyable._vptr_NonCopyable[4])(&tags);
        local_308 = (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                     *)CONCAT44(extraout_var_03,iVar8);
        RunContext::testGroupStarting(this_00,(string *)&tags,1,1);
        std::__cxx11::string::~string((string *)&tags);
        for (p_Var16 = tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pFVar7 = tests.m_matches.
                     super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
            sVar6 = tests.m_context.m_totals.assertions.failed,
            pFVar17 = tests.m_matches.
                      super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            (_Rb_tree_header *)p_Var16 != p_Var1;
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
          iVar8 = (*((tests.m_context.m_config.
                      super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_NonCopyable)._vptr_NonCopyable[9])();
          if (sVar6 < (ulong)(long)iVar8) {
            RunContext::runTest((Totals *)&tags,this_00,*(TestCase **)(p_Var16 + 1));
            Totals::operator+=(&totals,(Totals *)&tags);
          }
          else {
            (**(code **)(*(long *)tests.m_context.m_reporter._M_t.
                                  super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                  _M_head_impl + 0x78))
                      (tests.m_context.m_reporter._M_t.
                       super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                       .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,
                       *(undefined8 *)(p_Var16 + 1));
          }
        }
        for (; pFVar17 != pFVar7; pFVar17 = pFVar17 + 1) {
          if ((pFVar17->tests).
              super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              (pFVar17->tests).
              super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            (**(code **)(*(long *)tests.m_context.m_reporter._M_t.
                                  super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                  _M_head_impl + 0x18))
                      (tests.m_context.m_reporter._M_t.
                       super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                       .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,
                       pFVar17);
            totals.error = -1;
          }
        }
        lVar10 = *(long *)((long)local_308 + 0x18);
        lVar5 = *(long *)((long)local_308 + 0x20);
        if (lVar10 != lVar5) {
          for (; lVar10 != lVar5; lVar10 = lVar10 + 0x20) {
            (**(code **)(*(long *)tests.m_context.m_reporter._M_t.
                                  super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                  _M_head_impl + 0x20))
                      (tests.m_context.m_reporter._M_t.
                       super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                       .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,
                       lVar10);
          }
        }
        (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_IConfig).super_NonCopyable._vptr_NonCopyable[4])(&tags);
        RunContext::testGroupEnded(this_00,(string *)&tags,&totals,1,1);
        std::__cxx11::string::~string((string *)&tags);
        iVar8 = (*(((__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
        if (((byte)iVar8 & totals.error == -1) == 0) {
          iVar8 = (int)totals.assertions.failed;
          if ((int)totals.assertions.failed < totals.error) {
            iVar8 = totals.error;
          }
          if (0xfe < iVar8) {
            iVar8 = 0xff;
          }
        }
        else {
          iVar8 = 2;
        }
        anon_unknown_1::TestGroup::~TestGroup(&tests);
      }
      else {
        iVar8 = *(int *)&((tests.m_config.
                           super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         super_IConfig).super_NonCopyable._vptr_NonCopyable;
      }
    }
  }
  else {
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return static_cast<int>( *listed );

            TestGroup tests { m_config };
            auto const totals = tests.execute();

            if( m_config->warnAboutNoTests() && totals.error == -1 )
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }